

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void formatGestureHeader(QDebug *d,char *className,QGesture *gesture)

{
  int t;
  QDebug *this;
  char *t_00;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = QDebug::operator<<(d,className);
  QDebug::operator<<(this,"(state=");
  t = *(int *)(*(long *)&gesture->field_0x8 + 0x7c);
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  local_38 = (QPointF)QMetaObject::enumerator(0x80e350);
  t_00 = (char *)QMetaEnum::valueToKey((ulonglong)&local_38);
  if (t_00 == (char *)0x0) {
    QDebug::operator<<(d,t);
  }
  else {
    QDebug::operator<<(d,t_00);
  }
  if ((*(byte *)(*(long *)&gesture->field_0x8 + 0xa0) & 1) != 0) {
    QDebug::operator<<(d,",hotSpot=");
    local_38.xp = *(qreal *)(*(long *)&gesture->field_0x8 + 0x80);
    local_38.yp = *(qreal *)(*(long *)&gesture->field_0x8 + 0x88);
    QtDebugUtils::formatQPoint<QPointF>(d,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void formatGestureHeader(QDebug d, const char *className, const QGesture *gesture)
{
     d << className << "(state=";
     QtDebugUtils::formatQEnum(d, gesture->state());
     if (gesture->hasHotSpot()) {
         d << ",hotSpot=";
         QtDebugUtils::formatQPoint(d, gesture->hotSpot());
     }
}